

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::SendRTCPData
          (RTPUDPv4Transmitter *this,char *data,size_t len,char *ip,unsigned_short port)

{
  undefined1 local_44 [8];
  sockaddr_in addr_serv;
  unsigned_short port_local;
  char *ip_local;
  size_t len_local;
  char *data_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x59;
  }
  else if (this->maxpacksize < len) {
    this_local._4_4_ = -0x5d;
  }
  else {
    addr_serv.sin_zero._2_2_ = port;
    unique0x100000aa = ip;
    memset(local_44,0,0x10);
    local_44._0_2_ = 2;
    local_44._4_4_ = inet_addr(stack0xffffffffffffffd0);
    local_44._2_2_ = htons(addr_serv.sin_zero._2_2_);
    sendto(this->rtpsock,data,len,0,(sockaddr *)local_44,0x10);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::SendRTCPData(const char *data, size_t len, const char* ip, unsigned short port)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK

	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_SPECIFIEDSIZETOOBIG;
	}

	struct sockaddr_in addr_serv;
  	memset(&addr_serv, 0, sizeof(addr_serv));
  	addr_serv.sin_family = AF_INET;
  	addr_serv.sin_addr.s_addr = inet_addr(ip);
  	addr_serv.sin_port = htons(port);

	sendto(rtpsock, (const char *)data, len, 0, (const struct sockaddr *)&addr_serv, sizeof(struct sockaddr_in));
	
	MAINMUTEX_UNLOCK
	return 0;
}